

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Model.pb.cc
# Opt level: O2

size_t __thiscall CoreML::Specification::ModelDescription::ByteSizeLong(ModelDescription *this)

{
  uint uVar1;
  string *psVar2;
  Type *pTVar3;
  size_t sVar4;
  size_t sVar5;
  uint i;
  uint uVar6;
  ulong uVar7;
  long lVar8;
  
  uVar1 = (this->input_).super_RepeatedPtrFieldBase.current_size_;
  uVar7 = (ulong)uVar1;
  for (uVar6 = 0; uVar1 != uVar6; uVar6 = uVar6 + 1) {
    pTVar3 = google::protobuf::internal::RepeatedPtrFieldBase::
             Get<google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::TypeHandler>
                       (&(this->input_).super_RepeatedPtrFieldBase,uVar6);
    sVar4 = google::protobuf::internal::WireFormatLite::
            MessageSizeNoVirtual<CoreML::Specification::FeatureDescription>(pTVar3);
    uVar7 = uVar7 + sVar4;
  }
  uVar1 = (this->output_).super_RepeatedPtrFieldBase.current_size_;
  lVar8 = uVar7 + uVar1;
  for (uVar6 = 0; uVar1 != uVar6; uVar6 = uVar6 + 1) {
    pTVar3 = google::protobuf::internal::RepeatedPtrFieldBase::
             Get<google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::TypeHandler>
                       (&(this->output_).super_RepeatedPtrFieldBase,uVar6);
    sVar4 = google::protobuf::internal::WireFormatLite::
            MessageSizeNoVirtual<CoreML::Specification::FeatureDescription>(pTVar3);
    lVar8 = lVar8 + sVar4;
  }
  uVar1 = (this->traininginput_).super_RepeatedPtrFieldBase.current_size_;
  sVar4 = lVar8 + (ulong)uVar1 * 2;
  for (uVar6 = 0; uVar1 != uVar6; uVar6 = uVar6 + 1) {
    pTVar3 = google::protobuf::internal::RepeatedPtrFieldBase::
             Get<google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::TypeHandler>
                       (&(this->traininginput_).super_RepeatedPtrFieldBase,uVar6);
    sVar5 = google::protobuf::internal::WireFormatLite::
            MessageSizeNoVirtual<CoreML::Specification::FeatureDescription>(pTVar3);
    sVar4 = sVar4 + sVar5;
  }
  psVar2 = (this->predictedfeaturename_).ptr_;
  if (psVar2->_M_string_length != 0) {
    sVar5 = google::protobuf::internal::WireFormatLite::StringSize(psVar2);
    sVar4 = sVar4 + sVar5 + 1;
  }
  psVar2 = (this->predictedprobabilitiesname_).ptr_;
  if (psVar2->_M_string_length != 0) {
    sVar5 = google::protobuf::internal::WireFormatLite::StringSize(psVar2);
    sVar4 = sVar4 + sVar5 + 1;
  }
  if (this->metadata_ != (Metadata *)0x0 &&
      this != (ModelDescription *)&_ModelDescription_default_instance_) {
    sVar5 = google::protobuf::internal::WireFormatLite::
            MessageSizeNoVirtual<CoreML::Specification::Metadata>(this->metadata_);
    sVar4 = sVar4 + sVar5 + 2;
  }
  this->_cached_size_ = (int)sVar4;
  return sVar4;
}

Assistant:

size_t ModelDescription::ByteSizeLong() const {
// @@protoc_insertion_point(message_byte_size_start:CoreML.Specification.ModelDescription)
  size_t total_size = 0;

  // repeated .CoreML.Specification.FeatureDescription input = 1;
  {
    unsigned int count = this->input_size();
    total_size += 1UL * count;
    for (unsigned int i = 0; i < count; i++) {
      total_size +=
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          this->input(i));
    }
  }

  // repeated .CoreML.Specification.FeatureDescription output = 10;
  {
    unsigned int count = this->output_size();
    total_size += 1UL * count;
    for (unsigned int i = 0; i < count; i++) {
      total_size +=
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          this->output(i));
    }
  }

  // repeated .CoreML.Specification.FeatureDescription trainingInput = 50;
  {
    unsigned int count = this->traininginput_size();
    total_size += 2UL * count;
    for (unsigned int i = 0; i < count; i++) {
      total_size +=
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          this->traininginput(i));
    }
  }

  // string predictedFeatureName = 11;
  if (this->predictedfeaturename().size() > 0) {
    total_size += 1 +
      ::google::protobuf::internal::WireFormatLite::StringSize(
        this->predictedfeaturename());
  }

  // string predictedProbabilitiesName = 12;
  if (this->predictedprobabilitiesname().size() > 0) {
    total_size += 1 +
      ::google::protobuf::internal::WireFormatLite::StringSize(
        this->predictedprobabilitiesname());
  }

  // .CoreML.Specification.Metadata metadata = 100;
  if (this->has_metadata()) {
    total_size += 2 +
      ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
        *this->metadata_);
  }

  int cached_size = ::google::protobuf::internal::ToCachedSize(total_size);
  GOOGLE_SAFE_CONCURRENT_WRITES_BEGIN();
  _cached_size_ = cached_size;
  GOOGLE_SAFE_CONCURRENT_WRITES_END();
  return total_size;
}